

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.c
# Opt level: O1

apx_error_t decode_range_check_int64(apx_vm_decoder_t *self,uint8_t variant)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  apx_error_t aVar3;
  
  uVar1 = apx_vm_variant_to_size('\a');
  aVar3 = 0x42;
  if (self->program_next + (ulong)uVar1 * 2 <= self->program_end) {
    puVar2 = apx_vm_parse_int64_by_variant
                       (self->program_next,self->program_end,'\a',
                        &(self->range_check_int64_info).lower_limit);
    aVar3 = 0x30;
    if ((self->program_next < puVar2) && (self->program_next <= self->program_end)) {
      self->program_next = puVar2;
      puVar2 = apx_vm_parse_int64_by_variant
                         (puVar2,self->program_end,'\a',&(self->range_check_int64_info).upper_limit)
      ;
      if ((self->program_next < puVar2) && (self->program_next <= self->program_end)) {
        self->program_next = puVar2;
        aVar3 = 0;
      }
    }
  }
  return aVar3;
}

Assistant:

static apx_error_t decode_range_check_int64(apx_vm_decoder_t* self, uint8_t variant)
{
   size_t data_size = (size_t)apx_vm_variant_to_size(variant);
   if (self->program_next + (data_size * 2u) <= self->program_end) //The numbers always comes in pairs
   {
      uint8_t const* result = apx_vm_parse_int64_by_variant(self->program_next, self->program_end, variant, &self->range_check_int64_info.lower_limit);
      if ((result > self->program_next) && (self->program_next <= self->program_end))
      {
         self->program_next = result;
      }
      else
      {
    	  return APX_INVALID_INSTRUCTION_ERROR;
      }
      result = apx_vm_parse_int64_by_variant(self->program_next, self->program_end, variant, &self->range_check_int64_info.upper_limit);
      if ((result > self->program_next) && (self->program_next <= self->program_end))
      {
         self->program_next = result;
      }
      else
      {
    	  return APX_INVALID_INSTRUCTION_ERROR;
      }
      return APX_NO_ERROR;
   }
   return APX_UNEXPECTED_END_ERROR;
}